

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

void __thiscall
gl4cts::DirectStateAccess::Textures::StorageMultisampleTest::InputTextureImage<3u>
          (StorageMultisampleTest *this,GLenum internal_format,GLuint width,GLuint height,
          GLuint depth,GLenum format,GLenum type,GLvoid *data)

{
  code *pcVar1;
  int iVar2;
  GLenum GVar3;
  deUint32 err;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  Functions *gl;
  GLenum format_local;
  GLuint depth_local;
  GLuint height_local;
  GLuint width_local;
  GLenum internal_format_local;
  StorageMultisampleTest *this_local;
  
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  pcVar1 = *(code **)(CONCAT44(extraout_var,iVar2) + 0x1320);
  GVar3 = InputTextureTarget<3u>();
  (*pcVar1)(GVar3,0,internal_format,width,height,depth,0,format,type,data);
  err = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  glu::checkError(err,"glTexImage2D has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xd13);
  return;
}

Assistant:

void StorageMultisampleTest::InputTextureImage<3>(const glw::GLenum internal_format, const glw::GLuint width,
												  const glw::GLuint height, const glw::GLuint depth,
												  const glw::GLenum format, const glw::GLenum type,
												  const glw::GLvoid* data)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Data setup. */
	gl.texImage3D(InputTextureTarget<3>(), 0, internal_format, width, height, depth, 0, format, type, data);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage2D has failed");
}